

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

filepos_t UpdateBlockSize(matroska_block *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                         int ForProfile)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  ebml_context *peVar4;
  ebml_master *peVar5;
  ebml_integer *Element_00;
  int64_t iVar6;
  size_t sVar7;
  filepos_t fVar8;
  void *pvVar9;
  matroska_block *pmVar10;
  long local_a0;
  filepos_t Result_2;
  size_t i_2;
  filepos_t Result_1;
  filepos_t Size_1;
  size_t i_1;
  filepos_t Result;
  filepos_t Size;
  filepos_t PrevSize;
  size_t i;
  bool_t CanCompress;
  ebml_element *Elt2;
  ebml_element *Elt;
  ebml_integer *peStack_38;
  MatroskaTrackEncodingCompAlgo CompressionAlgo;
  ebml_element *Header;
  MatroskaContentEncodingScope CompressionScope;
  int ForProfile_local;
  bool_t bForceWithoutMandatory_local;
  bool_t bWithDefault_local;
  matroska_block *Element_local;
  
  Header._0_4_ = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
  if (Element == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x79f,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
  }
  lVar3 = (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0xa0))(Element,bWithDefault);
  if (lVar3 != 0) {
    peStack_38 = (ebml_integer *)0x0;
    Elt._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
    if (Element->Lacing == '\x04') {
      cVar1 = GetBestLacingType(Element,ForProfile);
      Element->Lacing = cVar1;
    }
    if (Element->WriteTrack == (ebml_master *)0x0) {
      __assert_fail("Element->WriteTrack!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x7a8,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
    }
    peVar5 = Element->WriteTrack;
    peVar4 = MATROSKA_getContextContentEncodings();
    peVar5 = (ebml_master *)EBML_MasterFindFirstElt(peVar5,peVar4,0,0,0);
    if (peVar5 != (ebml_master *)0x0) {
      peVar4 = MATROSKA_getContextContentEncoding();
      peVar5 = (ebml_master *)EBML_MasterFindFirstElt(peVar5,peVar4,0,0,0);
      if ((peVar5->Base).Base.Children != (nodetree *)0x0) {
        if (peVar5 == (ebml_master *)(peVar5->Base).Base.Next) {
          __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7af,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
        }
        if ((peVar5->Base).Base.Next != (nodetree *)0x0) {
          return (filepos_t)(matroska_block *)0xfffffffffffffffd;
        }
        peVar4 = MATROSKA_getContextContentEncodingScope();
        Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(peVar5,peVar4,0,0,0);
        if (Element_00 != (ebml_integer *)0x0) {
          iVar6 = EBML_IntegerValue(Element_00);
          Header._0_4_ = (MatroskaContentEncodingScope)iVar6;
        }
        peVar4 = MATROSKA_getContextContentCompression();
        peVar5 = (ebml_master *)EBML_MasterFindFirstElt(peVar5,peVar4,0,0,0);
        if (peVar5 == (ebml_master *)0x0) {
          return (filepos_t)(matroska_block *)0xfffffffffffffffd;
        }
        peVar4 = MATROSKA_getContextContentCompAlgo();
        peStack_38 = (ebml_integer *)EBML_MasterFindFirstElt(peVar5,peVar4,1,1,ForProfile);
        if (peStack_38 != (ebml_integer *)0x0) {
          iVar6 = EBML_IntegerValue(peStack_38);
          Elt._4_4_ = (MatroskaTrackEncodingCompAlgo)iVar6;
        }
        if (Elt._4_4_ != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP &&
            Elt._4_4_ != MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
          return (filepos_t)(matroska_block *)0xfffffffffffffffd;
        }
        if (Elt._4_4_ == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) {
          peVar4 = MATROSKA_getContextContentCompSettings();
          peStack_38 = (ebml_integer *)EBML_MasterFindFirstElt(peVar5,peVar4,0,0,0);
        }
      }
    }
    if (Element->Lacing == '\0') {
      if (Element == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Element->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x7d1,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
      }
      if ((Element->SizeList)._Used >> 2 != 1) {
        __assert_fail("ARRAYCOUNT(Element->SizeList,int32_t) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x7d1,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
      }
      sVar7 = GetBlockHeadSize(Element);
      fVar8 = GetBlockFrameSize(Element,0,&peStack_38->Base,Elt._4_4_,
                                (MatroskaContentEncodingScope)Header);
      (Element->Base).Base.DataSize = sVar7 + fVar8;
    }
    else if (Element->Lacing == '\x03') {
      sVar7 = GetBlockHeadSize(Element);
      Result = GetBlockFrameSize(Element,0,&peStack_38->Base,Elt._4_4_,
                                 (MatroskaContentEncodingScope)Header);
      bVar2 = EBML_CodedSizeLength(Result,'\0',1);
      i_1 = (ulong)bVar2 + Result + sVar7 + 1;
      PrevSize = 1;
      while( true ) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7db,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
        }
        if (((Element->SizeList)._Used >> 2) - 1 <= (ulong)PrevSize) break;
        fVar8 = GetBlockFrameSize(Element,PrevSize,&peStack_38->Base,Elt._4_4_,
                                  (MatroskaContentEncodingScope)Header);
        bVar2 = EBML_CodedSizeLengthSigned(fVar8 - Result,'\0');
        i_1 = fVar8 + (ulong)bVar2 + i_1;
        PrevSize = PrevSize + 1;
        Result = fVar8;
      }
      fVar8 = GetBlockFrameSize(Element,PrevSize,&peStack_38->Base,Elt._4_4_,
                                (MatroskaContentEncodingScope)Header);
      (Element->Base).Base.DataSize = fVar8 + i_1;
    }
    else if (Element->Lacing == '\x01') {
      sVar7 = GetBlockHeadSize(Element);
      i_2 = sVar7 + 1;
      Size_1 = 0;
      while( true ) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7e9,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
        }
        if (((Element->SizeList)._Used >> 2) - 1 <= (ulong)Size_1) break;
        fVar8 = GetBlockFrameSize(Element,Size_1,&peStack_38->Base,Elt._4_4_,
                                  (MatroskaContentEncodingScope)Header);
        i_2 = fVar8 / 0xff + 1 + fVar8 + i_2;
        Size_1 = Size_1 + 1;
      }
      fVar8 = GetBlockFrameSize(Element,Size_1,&peStack_38->Base,Elt._4_4_,
                                (MatroskaContentEncodingScope)Header);
      (Element->Base).Base.DataSize = fVar8 + i_2;
    }
    else if (Element->Lacing == '\x02') {
      sVar7 = GetBlockHeadSize(Element);
      local_a0 = sVar7 + 1;
      Result_2 = 0;
      while( true ) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x7f5,"filepos_t UpdateBlockSize(matroska_block *, bool_t, bool_t, int)");
        }
        if ((Element->SizeList)._Used >> 2 <= (ulong)Result_2) break;
        fVar8 = GetBlockFrameSize(Element,Result_2,&peStack_38->Base,Elt._4_4_,
                                  (MatroskaContentEncodingScope)Header);
        local_a0 = fVar8 + local_a0;
        Result_2 = Result_2 + 1;
      }
      (Element->Base).Base.DataSize = local_a0;
    }
  }
  pvVar9 = Node_InheritedVMT((node *)Element,0x4e494245);
  pmVar10 = (matroska_block *)
            (**(code **)((long)pvVar9 + 0x98))
                      (Element,bWithDefault,bForceWithoutMandatory,ForProfile);
  return (filepos_t)pmVar10;
}

Assistant:

static filepos_t UpdateBlockSize(matroska_block *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    if (EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault))
    {
        ebml_element *Header = NULL;
#if defined(CONFIG_EBML_WRITING)
        MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
        ebml_element *Elt, *Elt2;
        if (Element->Lacing == LACING_AUTO)
            Element->Lacing = GetBestLacingType(Element,ForProfile);

        assert(Element->WriteTrack!=NULL);
        Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
        if (Elt)
        {
            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
            if (EBML_MasterChildren(Elt))
            {
                if (EBML_MasterNext(Elt))
                    return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

                Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
                if (Elt2)
                    CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

                Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
                if (!Elt)
                    return ERR_INVALID_DATA; // TODO: support encryption

                Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
                if (Header)
                    CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
                bool_t CanCompress = 0;
                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                    CanCompress = 1;
#if defined(CONFIG_ZLIB)
                else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                    CanCompress = 1;
#endif
                if (!CanCompress)
                    return ERR_INVALID_DATA;

                if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                    Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
            }
        }
#else
        assert(Element->Lacing!=LACING_AUTO);
#endif

        if (Element->Lacing == LACING_NONE)
        {
            assert(ARRAYCOUNT(Element->SizeList,int32_t) == 1);
            Element->Base.Base.DataSize = GetBlockHeadSize(Element) + GetBlockFrameSize(Element,0,Header, CompressionAlgo, CompressionScope);
        }
        else if (Element->Lacing == LACING_EBML)
        {
            size_t i;
            filepos_t PrevSize, Size;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            Size = GetBlockFrameSize(Element,0,Header, CompressionAlgo, CompressionScope);
            Result += EBML_CodedSizeLength(Size,0,1) + Size;
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = Size;
                Size = GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
                Result += Size + EBML_CodedSizeLengthSigned(Size - PrevSize,0);
            }
            Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            size_t i;
            filepos_t Size;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                Size = GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
                Result += (Size / 0xFF + 1) + Size;
            }
            Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            size_t i;
            filepos_t Result = GetBlockHeadSize(Element) + 1; // 1 for the number of frames
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
                Result += GetBlockFrameSize(Element,i,Header, CompressionAlgo, CompressionScope);
            Element->Base.Base.DataSize = Result;
        }
#ifdef TODO
        char LacingHere;
        // compute the final size of the data
        switch (ARRAYCOUNT(Element->SizeList,int32_t))
        {
            case 0:
                Element->Base.Base.DataSize = 0;
                break;
            case 1:
                Element->Base.Base.DataSize = 4 + *ARRAYBEGIN(Element->SizeList,int32_t);
                break;
            default:
                Element->Base.Base.DataSize = 4 + 1; // 1 for the lacing head
                if (Element->Lacing == LACING_AUTO)
                    LacingHere = GetBestLacingType(Element,ForProfile);
                else
                    LacingHere = Element->Lacing;
                switch (LacingHere)
                {
                case LACING_XIPH:
                    for (i=0; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize() + (myBuffers[i]->DataSize() / 0xFF + 1));
                    }
                    break;
                case LACING_EBML:
                    SetSize_(GetSize() + myBuffers[0]->DataSize() + CodedSizeLength(myBuffers[0]->DataSize(), 0, IsFiniteSize()));
                    for (i=1; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize() + CodedSizeLengthSigned(int64(myBuffers[i]->DataSize()) - int64(myBuffers[i-1]->DataSize()), 0));
                    }
                    break;
                case LACING_FIXED:
                    for (i=0; i<myBuffers.size()-1; i++) {
                        SetSize_(GetSize() + myBuffers[i]->DataSize());
                    }
                    break;
                default:
                    assert(0);
                }
                // DataSize of the last frame (not in lace)
                SetSize_(GetSize() + myBuffers[i]->DataSize());
                break;
        }

        if (Element->Base.Base.DataSize && Element->TrackNumber >= 0x80)
            ++Element->Base.Base.DataSize; // the size will be coded with one more octet
#endif
    }

    // skip the EBML_BINARY_CLASS version as we have another internal buffer
    return INHERITED(Element,ebml_element_vmt,EBML_BINARY_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}